

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O0

Sequence * __thiscall
Sequence::operator*(Sequence *__return_storage_ptr__,Sequence *this,Sequence *t_seq)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  int local_2c;
  int i;
  Sequence *t_seq_local;
  Sequence *this_local;
  Sequence *res;
  
  iVar3 = size(this);
  Sequence(__return_storage_ptr__,iVar3);
  iVar3 = size(this);
  iVar4 = size(t_seq);
  if (iVar3 == iVar4) {
    for (local_2c = 0; iVar3 = size(t_seq), local_2c < iVar3; local_2c = local_2c + 1) {
      puVar5 = (uint *)std::deque<int,_std::allocator<int>_>::operator[]
                                 (&this->m_bits,(long)local_2c);
      uVar1 = *puVar5;
      puVar5 = (uint *)operator[](t_seq,local_2c);
      uVar2 = *puVar5;
      puVar5 = (uint *)operator[](__return_storage_ptr__,local_2c);
      *puVar5 = uVar1 ^ uVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::operator*(Sequence t_seq) {
    Sequence res(size());
    if (size() != t_seq.size()) {
        return res;
    }
    for (auto i = 0; i < t_seq.size(); ++i) {
        res[i] = m_bits[i] ^ t_seq[i];
    }
    return res;
}